

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics-graphics.cpp
# Opt level: O1

string * Statistics::Graphics::MessageScoreSavedPrompt_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream score_saved_richtext;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
  poVar1 = Color::operator<<((ostream *)aoStack_188,&green);
  poVar1 = Color::operator<<(poVar1,&bold_on);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Score saved!",0xc);
  poVar1 = Color::operator<<(poVar1,&bold_off);
  poVar1 = Color::operator<<(poVar1,&def);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return in_RDI;
}

Assistant:

std::string MessageScoreSavedPrompt() {
  constexpr auto score_saved_text = "Score saved!";
  constexpr auto sp = "  ";
  std::ostringstream score_saved_richtext;
  score_saved_richtext << "\n"
                       << green << bold_on << sp << score_saved_text << bold_off
                       << def << "\n";
  return score_saved_richtext.str();
}